

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::GetLinkDependencyFile
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmGeneratorTarget *target,string *param_2)

{
  string local_30;
  
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_30,target);
  cmStrCat<std::__cxx11::string,char_const(&)[8]>
            (__return_storage_ptr__,&local_30,(char (*) [8])"/link.d");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetLinkDependencyFile(
  cmGeneratorTarget* target, std::string const& /*config*/) const
{
  return cmStrCat(target->GetSupportDirectory(), "/link.d");
}